

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>::Resize
          (TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_> *this,int64_t newsize,
          TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *object)

{
  ulong uVar1;
  TPZReference *pTVar2;
  int64_t *piVar3;
  ostream *poVar4;
  ulong uVar5;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *pTVar6;
  long lVar7;
  long lVar8;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *pTVar9;
  long lVar10;
  
  if (newsize < 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ostream::flush();
    return;
  }
  lVar8 = this->fNElements;
  if (lVar8 != newsize) {
    if (newsize == 0) {
      pTVar9 = (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0;
    }
    else {
      uVar1 = newsize * 8;
      uVar5 = 0xffffffffffffffff;
      if (uVar1 < 0xfffffffffffffff8) {
        uVar5 = uVar1 + 8;
      }
      lVar8 = 0;
      piVar3 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3d != 0) | uVar5);
      *piVar3 = newsize;
      pTVar9 = (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)(piVar3 + 1);
      pTVar6 = pTVar9;
      do {
        TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::TPZAutoPointer(pTVar6);
        lVar8 = lVar8 + -8;
        pTVar6 = pTVar6 + 1;
      } while (-lVar8 != uVar1);
      lVar8 = this->fNElements;
    }
    if (newsize <= lVar8) {
      lVar8 = newsize;
    }
    lVar10 = 0;
    lVar7 = lVar8;
    if (lVar8 < 1) {
      lVar8 = lVar10;
      lVar7 = lVar10;
    }
    while (lVar8 != 0) {
      TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)((long)&pTVar9->fRef + lVar10)
                 ,(TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                  ((long)&this->fStore->fRef + lVar10));
      lVar10 = lVar10 + 8;
      lVar8 = lVar8 + -1;
    }
    pTVar6 = pTVar9 + lVar7;
    for (; lVar7 < newsize; lVar7 = lVar7 + 1) {
      TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=(pTVar6,object);
      pTVar6 = pTVar6 + 1;
    }
    pTVar6 = this->fStore;
    if (pTVar6 != (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0) {
      pTVar2 = pTVar6[-1].fRef;
      if (pTVar2 != (TPZReference *)0x0) {
        lVar8 = (long)pTVar2 * 8;
        do {
          TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::~TPZAutoPointer
                    ((TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)
                     ((long)&pTVar6[-1].fRef + lVar8));
          lVar8 = lVar8 + -8;
        } while (lVar8 != 0);
      }
      operator_delete__(pTVar6 + -1,(long)pTVar2 * 8 + 8);
      this->fStore = (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0;
    }
    this->fStore = pTVar9;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}